

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DataBuilderCollationIterator::fetchCEs
          (DataBuilderCollationIterator *this,UnicodeString *str,int32_t start,int64_t *ces,
          int32_t cesLength)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  uint c_00;
  uint32_t *puVar4;
  int64_t *piVar5;
  char16_t *pcVar6;
  int64_t iVar7;
  int iVar8;
  int64_t ce;
  CollationData *pCStack_40;
  int32_t i;
  CollationData *d;
  uint32_t ce32;
  UChar32 c;
  UErrorCode errorCode;
  int32_t cesLength_local;
  int64_t *ces_local;
  UnicodeString *pUStack_18;
  int32_t start_local;
  UnicodeString *str_local;
  DataBuilderCollationIterator *this_local;
  
  c = cesLength;
  _errorCode = ces;
  ces_local._4_4_ = start;
  pUStack_18 = str;
  str_local = (UnicodeString *)this;
  puVar4 = (uint32_t *)UVector32::getBuffer(&this->builder->ce32s);
  (this->builderData).ce32s = puVar4;
  piVar5 = UVector64::getBuffer(&this->builder->ce64s);
  (this->builderData).ces = piVar5;
  pcVar6 = UnicodeString::getBuffer(&this->builder->contexts);
  (this->builderData).contexts = pcVar6;
  CollationIterator::reset(&this->super_CollationIterator);
  this->s = pUStack_18;
  this->pos = ces_local._4_4_;
  ce32 = 0;
  while( true ) {
    UVar2 = ::U_SUCCESS(ce32);
    bVar1 = false;
    if (UVar2 != '\0') {
      iVar8 = this->pos;
      iVar3 = UnicodeString::length(this->s);
      bVar1 = iVar8 < iVar3;
    }
    if (!bVar1) break;
    CollationIterator::clearCEs(&this->super_CollationIterator);
    c_00 = UnicodeString::char32At(this->s,this->pos);
    iVar8 = 2;
    if (c_00 < 0x10000) {
      iVar8 = 1;
    }
    this->pos = iVar8 + this->pos;
    d._0_4_ = utrie2_get32_63(this->builder->trie,c_00);
    if ((uint32_t)d == 0xc0) {
      pCStack_40 = this->builder->base;
      d._0_4_ = CollationData::getCE32(this->builder->base,c_00);
    }
    else {
      pCStack_40 = &this->builderData;
    }
    CollationIterator::appendCEsFromCE32
              (&this->super_CollationIterator,pCStack_40,c_00,(uint32_t)d,'\x01',(UErrorCode *)&ce32
              );
    for (ce._4_4_ = 0; iVar3 = CollationIterator::getCEsLength(&this->super_CollationIterator),
        ce._4_4_ < iVar3; ce._4_4_ = ce._4_4_ + 1) {
      iVar7 = CollationIterator::getCE(&this->super_CollationIterator,ce._4_4_);
      if (iVar7 != 0) {
        if (c < 0x1f) {
          _errorCode[c] = iVar7;
        }
        c = c + 1;
      }
    }
  }
  return c;
}

Assistant:

int32_t
DataBuilderCollationIterator::fetchCEs(const UnicodeString &str, int32_t start,
                                       int64_t ces[], int32_t cesLength) {
    // Set the pointers each time, in case they changed due to reallocation.
    builderData.ce32s = reinterpret_cast<const uint32_t *>(builder.ce32s.getBuffer());
    builderData.ces = builder.ce64s.getBuffer();
    builderData.contexts = builder.contexts.getBuffer();
    // Modified copy of CollationIterator::nextCE() and CollationIterator::nextCEFromCE32().
    reset();
    s = &str;
    pos = start;
    UErrorCode errorCode = U_ZERO_ERROR;
    while(U_SUCCESS(errorCode) && pos < s->length()) {
        // No need to keep all CEs in the iterator buffer.
        clearCEs();
        UChar32 c = s->char32At(pos);
        pos += U16_LENGTH(c);
        uint32_t ce32 = utrie2_get32(builder.trie, c);
        const CollationData *d;
        if(ce32 == Collation::FALLBACK_CE32) {
            d = builder.base;
            ce32 = builder.base->getCE32(c);
        } else {
            d = &builderData;
        }
        appendCEsFromCE32(d, c, ce32, /*forward=*/ TRUE, errorCode);
        U_ASSERT(U_SUCCESS(errorCode));
        for(int32_t i = 0; i < getCEsLength(); ++i) {
            int64_t ce = getCE(i);
            if(ce != 0) {
                if(cesLength < Collation::MAX_EXPANSION_LENGTH) {
                    ces[cesLength] = ce;
                }
                ++cesLength;
            }
        }
    }
    return cesLength;
}